

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_imply_m(REF_DBL *m,REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2,REF_DBL *xyz3)

{
  int local_18c;
  REF_STATUS ref_private_macro_code_raise;
  REF_INT i;
  REF_DBL ab [42];
  REF_DBL *xyz3_local;
  REF_DBL *xyz2_local;
  REF_DBL *xyz1_local;
  REF_DBL *xyz0_local;
  REF_DBL *m_local;
  
  for (local_18c = 0; local_18c < 6; local_18c = local_18c + 1) {
    m[local_18c] = 0.0;
  }
  _ref_private_macro_code_raise = (*xyz1 - *xyz0) * (*xyz1 - *xyz0);
  ab[5] = (*xyz1 - *xyz0) * 2.0 * (xyz1[1] - xyz0[1]);
  ab[0xb] = (*xyz1 - *xyz0) * 2.0 * (xyz1[2] - xyz0[2]);
  ab[0x11] = (xyz1[1] - xyz0[1]) * (xyz1[1] - xyz0[1]);
  ab[0x17] = (xyz1[1] - xyz0[1]) * 2.0 * (xyz1[2] - xyz0[2]);
  ab[0x1d] = (xyz1[2] - xyz0[2]) * (xyz1[2] - xyz0[2]);
  ab[0] = (*xyz2 - *xyz0) * (*xyz2 - *xyz0);
  ab[6] = (*xyz2 - *xyz0) * 2.0 * (xyz2[1] - xyz0[1]);
  ab[0xc] = (*xyz2 - *xyz0) * 2.0 * (xyz2[2] - xyz0[2]);
  ab[0x12] = (xyz2[1] - xyz0[1]) * (xyz2[1] - xyz0[1]);
  ab[0x18] = (xyz2[1] - xyz0[1]) * 2.0 * (xyz2[2] - xyz0[2]);
  ab[0x1e] = (xyz2[2] - xyz0[2]) * (xyz2[2] - xyz0[2]);
  ab[1] = (*xyz3 - *xyz0) * (*xyz3 - *xyz0);
  ab[7] = (*xyz3 - *xyz0) * 2.0 * (xyz3[1] - xyz0[1]);
  ab[0xd] = (*xyz3 - *xyz0) * 2.0 * (xyz3[2] - xyz0[2]);
  ab[0x13] = (xyz3[1] - xyz0[1]) * (xyz3[1] - xyz0[1]);
  ab[0x19] = (xyz3[1] - xyz0[1]) * 2.0 * (xyz3[2] - xyz0[2]);
  ab[0x1f] = (xyz3[2] - xyz0[2]) * (xyz3[2] - xyz0[2]);
  ab[2] = (*xyz2 - *xyz1) * (*xyz2 - *xyz1);
  ab[8] = (*xyz2 - *xyz1) * 2.0 * (xyz2[1] - xyz1[1]);
  ab[0xe] = (*xyz2 - *xyz1) * 2.0 * (xyz2[2] - xyz1[2]);
  ab[0x14] = (xyz2[1] - xyz1[1]) * (xyz2[1] - xyz1[1]);
  ab[0x1a] = (xyz2[1] - xyz1[1]) * 2.0 * (xyz2[2] - xyz1[2]);
  ab[0x20] = (xyz2[2] - xyz1[2]) * (xyz2[2] - xyz1[2]);
  ab[3] = (*xyz3 - *xyz1) * (*xyz3 - *xyz1);
  ab[9] = (*xyz3 - *xyz1) * 2.0 * (xyz3[1] - xyz1[1]);
  ab[0xf] = (*xyz3 - *xyz1) * 2.0 * (xyz3[2] - xyz1[2]);
  ab[0x15] = (xyz3[1] - xyz1[1]) * (xyz3[1] - xyz1[1]);
  ab[0x1b] = (xyz3[1] - xyz1[1]) * 2.0 * (xyz3[2] - xyz1[2]);
  ab[0x21] = (xyz3[2] - xyz1[2]) * (xyz3[2] - xyz1[2]);
  ab[4] = (*xyz3 - *xyz2) * (*xyz3 - *xyz2);
  ab[10] = (*xyz3 - *xyz2) * 2.0 * (xyz3[1] - xyz2[1]);
  ab[0x10] = (*xyz3 - *xyz2) * 2.0 * (xyz3[2] - xyz2[2]);
  ab[0x16] = (xyz3[1] - xyz2[1]) * (xyz3[1] - xyz2[1]);
  ab[0x1c] = (xyz3[1] - xyz2[1]) * 2.0 * (xyz3[2] - xyz2[2]);
  ab[0x22] = (xyz3[2] - xyz2[2]) * (xyz3[2] - xyz2[2]);
  for (local_18c = 0; local_18c < 6; local_18c = local_18c + 1) {
    (&ref_private_macro_code_raise + (long)(local_18c + 0x24) * 2)[0] = 0;
    (&ref_private_macro_code_raise + (long)(local_18c + 0x24) * 2)[1] = 0x3ff00000;
  }
  ab[0x29] = (REF_DBL)xyz3;
  m_local._4_4_ = ref_matrix_solve_ab(6,7,(REF_DBL *)&ref_private_macro_code_raise);
  if (m_local._4_4_ == 0) {
    for (local_18c = 0; local_18c < 6; local_18c = local_18c + 1) {
      m[local_18c] = *(REF_DBL *)(&ref_private_macro_code_raise + (long)(local_18c + 0x24) * 2);
    }
    m_local._4_4_ = 0;
  }
  return m_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_imply_m(REF_DBL *m, REF_DBL *xyz0, REF_DBL *xyz1,
                                      REF_DBL *xyz2, REF_DBL *xyz3) {
  REF_DBL ab[42];
  REF_INT i;

  for (i = 0; i < 6; i++) m[i] = 0.0;

  fill_ab(0, xyz1, xyz0);
  fill_ab(1, xyz2, xyz0);
  fill_ab(2, xyz3, xyz0);
  fill_ab(3, xyz2, xyz1);
  fill_ab(4, xyz3, xyz1);
  fill_ab(5, xyz3, xyz2);

  for (i = 0; i < 6; i++) ab[i + 6 * 6] = 1.0;

  RAISE(ref_matrix_solve_ab(6, 7, ab));

  for (i = 0; i < 6; i++) m[i] = ab[i + 6 * 6];

  return REF_SUCCESS;
}